

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

VdbeCursor * allocateCursor(Vdbe *p,int iCur,int nField,u8 eCurType)

{
  VdbeCursor *__s;
  int iVar1;
  int iVar2;
  sqlite3 *psVar3;
  sqlite3 *db;
  Vdbe *pVVar4;
  u8 in_CL;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  VdbeCursor *pCx;
  int nByte;
  Mem *pMem;
  undefined4 in_stack_ffffffffffffffb0;
  sqlite3 *psVar5;
  
  if (in_ESI < 1) {
    psVar3 = *(sqlite3 **)(in_RDI + 0x68);
  }
  else {
    psVar3 = (sqlite3 *)(*(long *)(in_RDI + 0x68) + (long)(*(int *)(in_RDI + 0x24) - in_ESI) * 0x38)
    ;
  }
  db = (sqlite3 *)((long)in_EDX * 8 + 0x78);
  psVar5 = psVar3;
  if (in_CL == '\0') {
    iVar1 = sqlite3BtreeCursorSize();
  }
  else {
    iVar1 = 0;
  }
  iVar2 = (int)db + iVar1;
  if (*(long *)(*(long *)(in_RDI + 0x78) + (long)in_ESI * 8) != 0) {
    sqlite3VdbeFreeCursorNN((Vdbe *)psVar5,(VdbeCursor *)db);
    *(undefined8 *)(*(long *)(in_RDI + 0x78) + (long)in_ESI * 8) = 0;
  }
  if (*(int *)&psVar3->aDb < iVar2) {
    if (0 < *(int *)&psVar3->aDb) {
      sqlite3DbFreeNN(psVar5,db);
    }
    pVVar4 = (Vdbe *)sqlite3DbMallocRaw(db,CONCAT44(iVar1,in_stack_ffffffffffffffb0));
    *(Vdbe **)&psVar3->nDb = pVVar4;
    psVar3->pVdbe = pVVar4;
    if (*(long *)&psVar3->nDb == 0) {
      *(undefined4 *)&psVar3->aDb = 0;
      return (VdbeCursor *)0x0;
    }
    *(int *)&psVar3->aDb = iVar2;
  }
  __s = *(VdbeCursor **)&psVar3->nDb;
  *(VdbeCursor **)(*(long *)(in_RDI + 0x78) + (long)in_ESI * 8) = __s;
  memset(__s,0,0x20);
  __s->eCurType = in_CL;
  __s->nField = (i16)in_EDX;
  __s->aOffset = __s->aType + in_EDX;
  if (in_CL == '\0') {
    (__s->uc).pCursor = (BtCursor *)(psVar3->pVdbe->aCounter + (long)in_EDX * 2 + -0x17);
    sqlite3BtreeCursorZero((BtCursor *)0x185b74);
  }
  return __s;
}

Assistant:

static VdbeCursor *allocateCursor(
  Vdbe *p,              /* The virtual machine */
  int iCur,             /* Index of the new VdbeCursor */
  int nField,           /* Number of fields in the table or index */
  u8 eCurType           /* Type of the new cursor */
){
  /* Find the memory cell that will be used to store the blob of memory
  ** required for this VdbeCursor structure. It is convenient to use a
  ** vdbe memory cell to manage the memory allocation required for a
  ** VdbeCursor structure for the following reasons:
  **
  **   * Sometimes cursor numbers are used for a couple of different
  **     purposes in a vdbe program. The different uses might require
  **     different sized allocations. Memory cells provide growable
  **     allocations.
  **
  **   * When using ENABLE_MEMORY_MANAGEMENT, memory cell buffers can
  **     be freed lazily via the sqlite3_release_memory() API. This
  **     minimizes the number of malloc calls made by the system.
  **
  ** The memory cell for cursor 0 is aMem[0]. The rest are allocated from
  ** the top of the register space.  Cursor 1 is at Mem[p->nMem-1].
  ** Cursor 2 is at Mem[p->nMem-2]. And so forth.
  */
  Mem *pMem = iCur>0 ? &p->aMem[p->nMem-iCur] : p->aMem;

  int nByte;
  VdbeCursor *pCx = 0;
  nByte =
      ROUND8P(sizeof(VdbeCursor)) + 2*sizeof(u32)*nField +
      (eCurType==CURTYPE_BTREE?sqlite3BtreeCursorSize():0);

  assert( iCur>=0 && iCur<p->nCursor );
  if( p->apCsr[iCur] ){ /*OPTIMIZATION-IF-FALSE*/
    sqlite3VdbeFreeCursorNN(p, p->apCsr[iCur]);
    p->apCsr[iCur] = 0;
  }

  /* There used to be a call to sqlite3VdbeMemClearAndResize() to make sure
  ** the pMem used to hold space for the cursor has enough storage available
  ** in pMem->zMalloc.  But for the special case of the aMem[] entries used
  ** to hold cursors, it is faster to in-line the logic. */
  assert( pMem->flags==MEM_Undefined );
  assert( (pMem->flags & MEM_Dyn)==0 );
  assert( pMem->szMalloc==0 || pMem->z==pMem->zMalloc );
  if( pMem->szMalloc<nByte ){
    if( pMem->szMalloc>0 ){
      sqlite3DbFreeNN(pMem->db, pMem->zMalloc);
    }
    pMem->z = pMem->zMalloc = sqlite3DbMallocRaw(pMem->db, nByte);
    if( pMem->zMalloc==0 ){
      pMem->szMalloc = 0;
      return 0;
    }
    pMem->szMalloc = nByte;
  }

  p->apCsr[iCur] = pCx = (VdbeCursor*)pMem->zMalloc;
  memset(pCx, 0, offsetof(VdbeCursor,pAltCursor));
  pCx->eCurType = eCurType;
  pCx->nField = nField;
  pCx->aOffset = &pCx->aType[nField];
  if( eCurType==CURTYPE_BTREE ){
    pCx->uc.pCursor = (BtCursor*)
        &pMem->z[ROUND8P(sizeof(VdbeCursor))+2*sizeof(u32)*nField];
    sqlite3BtreeCursorZero(pCx->uc.pCursor);
  }
  return pCx;
}